

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O3

void __thiscall
irr::scene::CAnimatedMeshSceneNode::CAnimatedMeshSceneNode
          (CAnimatedMeshSceneNode *this,void **vtt,IAnimatedMesh *mesh,ISceneNode *parent,
          ISceneManager *mgr,s32 id,vector3df *position,vector3df *rotation,vector3df *scale)

{
  void *pvVar1;
  
  ISceneNode::ISceneNode((ISceneNode *)this,vtt + 2,parent,mgr,id,position,rotation,scale);
  pvVar1 = vtt[1];
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[4];
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[5];
  (this->Materials).m_data.
  super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Materials).m_data.
  super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Materials).m_data.
  super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Materials).is_sorted = true;
  (this->Box).MinEdge.X = -1.0;
  (this->Box).MinEdge.Y = -1.0;
  *(undefined8 *)&(this->Box).MinEdge.Z = 0x3f800000bf800000;
  (this->Box).MaxEdge.Y = 1.0;
  (this->Box).MaxEdge.Z = 1.0;
  this->Mesh = (IAnimatedMesh *)0x0;
  this->StartFrame = 0;
  this->EndFrame = 0;
  this->FramesPerSecond = 0.025;
  this->CurrentFrameNr = 0.0;
  this->LastTimeMs = 0;
  this->TransitionTime = 0;
  this->Transiting = 0.0;
  *(undefined8 *)((long)&this->TransitionTime + 1) = 0;
  *(undefined8 *)((long)&this->TransitingBlend + 1) = 0;
  this->Looping = true;
  (this->JointChildSceneNodes).m_data.
  super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->JointChildSceneNodes).m_data.
  super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->JointChildSceneNodes).m_data.
  super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&this->ReadOnlyMaterials = 0;
  *(undefined8 *)((long)&this->LoopCallBack + 4) = 0;
  (this->JointChildSceneNodes).is_sorted = true;
  (this->PretransitingSave).m_data.
  super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PretransitingSave).m_data.
  super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PretransitingSave).m_data.
  super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PretransitingSave).is_sorted = true;
  (**(code **)(*(long *)this + 0x198))(this,mesh);
  return;
}

Assistant:

CAnimatedMeshSceneNode::CAnimatedMeshSceneNode(IAnimatedMesh *mesh,
		ISceneNode *parent, ISceneManager *mgr, s32 id,
		const core::vector3df &position,
		const core::vector3df &rotation,
		const core::vector3df &scale) :
		IAnimatedMeshSceneNode(parent, mgr, id, position, rotation, scale),
		Mesh(0),
		StartFrame(0), EndFrame(0), FramesPerSecond(0.025f),
		CurrentFrameNr(0.f), LastTimeMs(0),
		TransitionTime(0), Transiting(0.f), TransitingBlend(0.f),
		JointMode(EJUOR_NONE), JointsUsed(false),
		Looping(true), ReadOnlyMaterials(false), RenderFromIdentity(false),
		LoopCallBack(0), PassCount(0)
{
#ifdef _DEBUG
	setDebugName("CAnimatedMeshSceneNode");
#endif

	setMesh(mesh);
}